

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

int doprgold(void)

{
  long amount;
  char *pcVar1;
  long umoney;
  
  amount = money_cnt(invent);
  if (amount == 0) {
    pline("Your wallet is empty.");
  }
  else {
    pcVar1 = currency(amount);
    pline("Your wallet contains %ld %s.",amount,pcVar1);
  }
  shopper_financial_report();
  return 0;
}

Assistant:

int doprgold(void)
{
	/* the messages used to refer to "carrying gold", but that didn't
	   take containers into account */
        long umoney = money_cnt(invent);
	if (!umoney)
	    pline("Your wallet is empty.");
	else
	    pline("Your wallet contains %ld %s.", umoney, currency(umoney));

	shopper_financial_report();
	return 0;
}